

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

bool __thiscall Tokenizer::tryToGetKeywordOrIdentifier(Tokenizer *this)

{
  TokenType TVar1;
  Mark MVar2;
  char cVar3;
  int iVar4;
  Mark *pMVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  bool bVar8;
  long *plVar9;
  string str;
  stringstream ss;
  undefined1 local_251;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *local_250;
  key_type local_248;
  TokenType local_228 [2];
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  byte local_200;
  Mark local_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  pMVar5 = Stream::getMark(&this->stream_);
  MVar2 = *pMVar5;
  cVar3 = Stream::peek(&this->stream_);
  iVar4 = isalpha((int)cVar3);
  if ((iVar4 == 0) && (cVar3 = Stream::peek(&this->stream_), cVar3 != '_')) {
    bVar8 = false;
    goto LAB_001633fc;
  }
  cVar3 = Stream::peek(&this->stream_);
  local_228[0] = CONCAT31(local_228[0]._1_3_,cVar3);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)local_228,1);
  Stream::advance(&this->stream_);
  while( true ) {
    cVar3 = Stream::peek(&this->stream_);
    iVar4 = isalpha((int)cVar3);
    if (((iVar4 == 0) && (cVar3 = Stream::peek(&this->stream_), 9 < (int)cVar3 - 0x30U)) &&
       (cVar3 = Stream::peek(&this->stream_), cVar3 != '_')) break;
    cVar3 = Stream::peek(&this->stream_);
    local_228[0] = CONCAT31(local_228[0]._1_3_,cVar3);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)local_228,1);
    Stream::advance(&this->stream_);
  }
  std::__cxx11::stringbuf::str();
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&keywords__abi_cxx11_._M_t,&local_248);
  local_1f8 = MVar2;
  if ((_Rb_tree_header *)cVar6._M_node == &keywords__abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
  {
    local_1f0 = local_1e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f0,local_248._M_dataplus._M_p,
               local_248._M_dataplus._M_p + local_248._M_string_length);
    local_228[0] = Identifier;
    local_220[0] = local_210;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_220,local_1f0,local_1e8 + (long)local_1f0);
    local_200 = 0;
    (this->token_).type = local_228[0];
    local_250 = &(this->token_).value;
    std::operator=(&local_250,(string *)local_220,&local_251);
    (this->token_).mark = local_1f8;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
      ::_S_vtable._M_arr[local_200]._M_data)
              ((anon_class_1_0_00000001 *)&local_250,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                *)local_220);
    local_200 = 0xff;
    plVar9 = local_1f0;
    if (local_1f0 != local_1e0) goto LAB_001633d7;
  }
  else {
    cVar7 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&keywordTokenTypes__abi_cxx11_._M_h,&local_248);
    if (cVar7.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    TVar1 = *(TokenType *)
             ((long)cVar7.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
                    ._M_cur + 0x28);
    local_1d0 = local_1c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d0,local_248._M_dataplus._M_p,
               local_248._M_dataplus._M_p + local_248._M_string_length);
    local_220[0] = local_210;
    local_228[0] = TVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_220,local_1d0,local_1c8 + (long)local_1d0);
    local_200 = 0;
    (this->token_).type = local_228[0];
    local_250 = &(this->token_).value;
    std::operator=(&local_250,(string *)local_220,&local_251);
    (this->token_).mark = local_1f8;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
      ::_S_vtable._M_arr[local_200]._M_data)
              ((anon_class_1_0_00000001 *)&local_250,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                *)local_220);
    local_200 = 0xff;
    local_1e0[0] = local_1c0[0];
    plVar9 = local_1d0;
    if (local_1d0 != local_1c0) {
LAB_001633d7:
      local_200 = 0xff;
      operator_delete(plVar9,local_1e0[0] + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  bVar8 = true;
LAB_001633fc:
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return bVar8;
}

Assistant:

bool Tokenizer::tryToGetKeywordOrIdentifier()
{
  std::stringstream ss;
  const Mark mark = stream_.getMark();
  if(isalpha(stream_.peek()) || stream_.peek() == '_')
  {
    ss << (char)stream_.peek();
    stream_.advance();
    while(isalpha(stream_.peek()) || isdigit(stream_.peek()) || stream_.peek() == '_')
    {
      ss << (char)stream_.peek();
      stream_.advance();
    }
  }
  else
    return false;

  const std::string str = ss.str();
  if(keywords_.find(str) != keywords_.end())
  {
    const auto type = keywordTokenTypes_.at(str);
    token_ = Token{type, str, mark};
  }
  else
    token_ = Token{TokenType::Identifier, str, mark};

  return true;
}